

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

HighsInt __thiscall
HighsCliqueTable::getNumImplications(HighsCliqueTable *this,HighsInt col,bool val)

{
  HighsInt HVar1;
  char *pcVar2;
  reference pvVar3;
  byte in_DL;
  int __c;
  uint in_ESI;
  HighsHashTree<int,_int> *in_RDI;
  HighsInt numimplics;
  HighsInt iVal;
  CliqueVar local_18;
  int local_14;
  byte local_d;
  
  local_d = in_DL & 1;
  pcVar2 = (char *)(ulong)in_ESI;
  CliqueVar::CliqueVar(&local_18,in_ESI,(uint)local_d);
  pcVar2 = CliqueVar::index(&local_18,pcVar2,__c);
  local_14 = (int)pcVar2;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_14);
  HVar1 = *pvVar3;
  std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::operator[]
            ((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
             (in_RDI + 3),(long)local_14);
  HighsHashTree<int,int>::for_each<HighsCliqueTable::getNumImplications(int,bool)::__0>
            (in_RDI,(anon_class_16_2_ec33deae *)in_RDI);
  return HVar1;
}

Assistant:

HighsInt HighsCliqueTable::getNumImplications(HighsInt col, bool val) {
  HighsInt iVal = CliqueVar(col, val).index();

  // each size two clique is one implication
  HighsInt numimplics = numcliquesvar[iVal];

  // now loop over cliques larger than size two and add the cliquelength - 1 as
  // additional implications
  invertedHashList[iVal].for_each([&](HighsInt cliqueid) {
    HighsInt nimplics = cliques[cliqueid].end - cliques[cliqueid].start - 1;
    nimplics *= (1 + cliques[cliqueid].equality);
    numimplics += nimplics - 1;
  });

  return numimplics;
}